

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

int scale_expansion_zeroelim(int elen,double *e,double b,double *h)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double err3;
  double err2;
  double err1;
  double blo;
  double bhi;
  double alo;
  double ahi;
  double abig;
  double c;
  double around;
  double bround;
  double avirt;
  double bvirt;
  double enow;
  int hindex;
  int eindex;
  double product0;
  double product1;
  double hh;
  double sum;
  double Q;
  double *h_local;
  double b_local;
  double *e_local;
  int elen_local;
  
  dVar1 = splitter * b - (splitter * b - b);
  dVar2 = b - dVar1;
  sum = *e * b;
  dVar3 = splitter * *e - (splitter * *e - *e);
  dVar3 = (*e - dVar3) * dVar2 + -(-dVar3 * dVar2 + -(*e - dVar3) * dVar1 + -dVar3 * dVar1 + sum);
  enow._0_4_ = 0;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    enow._0_4_ = 1;
    *h = dVar3;
  }
  for (enow._4_4_ = 1; enow._4_4_ < elen; enow._4_4_ = enow._4_4_ + 1) {
    dVar3 = e[enow._4_4_];
    dVar4 = dVar3 * b;
    dVar5 = splitter * dVar3 - (splitter * dVar3 - dVar3);
    dVar3 = (dVar3 - dVar5) * dVar2 +
            -(-dVar5 * dVar2 + -(dVar3 - dVar5) * dVar1 + -dVar5 * dVar1 + dVar4);
    dVar5 = sum + dVar3;
    dVar3 = (sum - (dVar5 - (dVar5 - sum))) + (dVar3 - (dVar5 - sum));
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      h[enow._0_4_] = dVar3;
      enow._0_4_ = enow._0_4_ + 1;
    }
    sum = dVar4 + dVar5;
    dVar5 = dVar5 - (sum - dVar4);
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      h[enow._0_4_] = dVar5;
      enow._0_4_ = enow._0_4_ + 1;
    }
  }
  if (((sum != 0.0) || (NAN(sum))) || (enow._0_4_ == 0)) {
    h[enow._0_4_] = sum;
    enow._0_4_ = enow._0_4_ + 1;
  }
  return enow._0_4_;
}

Assistant:

int scale_expansion_zeroelim(int elen, REAL *e, REAL b, REAL *h)
/* e and h cannot be the same. */
{
  INEXACT REAL Q, sum;
  REAL hh;
  INEXACT REAL product1;
  REAL product0;
  int eindex, hindex;
  REAL enow;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;

  Split(b, bhi, blo);
  Two_Product_Presplit(e[0], b, bhi, blo, Q, hh);
  hindex = 0;
  if (hh != 0) {
    h[hindex++] = hh;
  }
  for (eindex = 1; eindex < elen; eindex++) {
    enow = e[eindex];
    Two_Product_Presplit(enow, b, bhi, blo, product1, product0);
    Two_Sum(Q, product0, sum, hh);
    if (hh != 0) {
      h[hindex++] = hh;
    }
    Fast_Two_Sum(product1, sum, Q, hh);
    if (hh != 0) {
      h[hindex++] = hh;
    }
  }
  if ((Q != 0.0) || (hindex == 0)) {
    h[hindex++] = Q;
  }
  return hindex;
}